

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O2

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_Nan_Test::Body(iu_SyntaxTest_x_iutest_x_Nan_Test *this)

{
  Fixed *pFVar1;
  float fnan;
  double dnan;
  AssertionResult iutest_ar;
  float local_1f4;
  double local_1f0;
  AssertionResult local_1e8;
  iuCodeMessage local_1c0;
  Fixed local_190;
  
  local_1f4 = NAN;
  local_1f0 = NAN;
  iuutil::CmpHelperIsNan<float>(&local_1e8,"fnan",&local_1f4);
  if (local_1e8.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_190,local_1f4);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
               ,0x1eb,local_1e8.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,pFVar1);
  }
  else {
    std::__cxx11::string::~string((string *)&local_1e8);
    if ((local_1f4 != 0.0) || (NAN(local_1f4))) {
      iuutil::CmpHelperIsNan<float>(&local_1e8,"fnan",&local_1f4);
      if (local_1e8.m_result == false) {
        memset(&local_190,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)&local_190);
        pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_190,local_1f4);
        iutest::detail::iuCodeMessage::iuCodeMessage
                  (&local_1c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                   ,0x1ed,local_1e8.m_message._M_dataplus._M_p);
        local_1c0._44_4_ = 1;
        iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,pFVar1);
        std::__cxx11::string::~string((string *)&local_1c0);
        iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                  ((iu_global_format_stringstream *)&local_190);
      }
      std::__cxx11::string::~string((string *)&local_1e8);
    }
    if ((local_1f0 != 0.0) || (NAN(local_1f0))) {
      iuutil::CmpHelperIsNan<double>(&local_1e8,"dnan",&local_1f0);
      if (local_1e8.m_result == false) {
        memset(&local_190,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)&local_190);
        pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_190,local_1f0);
        iutest::detail::iuCodeMessage::iuCodeMessage
                  (&local_1c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                   ,0x1ef,local_1e8.m_message._M_dataplus._M_p);
        local_1c0._44_4_ = 0xffffffff;
        iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,pFVar1);
        std::__cxx11::string::~string((string *)&local_1c0);
        iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                  ((iu_global_format_stringstream *)&local_190);
      }
      std::__cxx11::string::~string((string *)&local_1e8);
    }
    if ((local_1f0 == 0.0) && (!NAN(local_1f0))) {
      return;
    }
    iuutil::CmpHelperIsNan<double>(&local_1e8,"dnan",&local_1f0);
    if (local_1e8.m_result != false) goto LAB_002e4044;
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_190,local_1f0);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
               ,0x1f1,local_1e8.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 0xfffffffd;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,pFVar1);
  }
  std::__cxx11::string::~string((string *)&local_1c0);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_190);
LAB_002e4044:
  std::__cxx11::string::~string((string *)&local_1e8);
  return;
}

Assistant:

IUTEST(SyntaxTest, Nan)
{
    float  fnan = ::std::numeric_limits<float>::quiet_NaN();
    double dnan = ::std::numeric_limits<double>::quiet_NaN();
    if( fnan )
        IUTEST_ASSERT_NAN(fnan) << fnan;
    if( fnan )
        IUTEST_EXPECT_NAN(fnan) << fnan;
    if( dnan )
        IUTEST_INFORM_NAN(dnan) << dnan;
    if( dnan )
        IUTEST_ASSUME_NAN(dnan) << dnan;
}